

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

BCReg rec_mm_prep(jit_State *J,ASMFunction cont)

{
  uint uVar1;
  TRef TVar2;
  void *in_RSI;
  long in_RDI;
  jit_State *unaff_retaddr;
  TRef trcont;
  BCReg top;
  BCReg s;
  undefined4 local_14;
  
  uVar1 = (uint)*(byte *)((ulong)*(uint *)((ulong)*(uint *)(*(long *)(*(long *)(in_RDI + 0x60) +
                                                                     0x10) + -8) + 0x10) - 0x39);
  *(long *)(*(long *)(*(long *)(in_RDI + 0x60) + 0x10) + (ulong)uVar1 * 8) =
       (long)in_RSI + -0x19e100;
  TVar2 = lj_ir_kptr_(unaff_retaddr,(IROp)((ulong)in_RDI >> 0x20),in_RSI);
  *(TRef *)(*(long *)(in_RDI + 0x80) + (ulong)uVar1 * 4) = TVar2 | 0x20000;
  *(int *)(in_RDI + 0xcc) = *(int *)(in_RDI + 0xcc) + 1;
  for (local_14 = *(uint *)(in_RDI + 0x8c); local_14 < uVar1; local_14 = local_14 + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 0x80) + (ulong)local_14 * 4) = 0;
  }
  return uVar1 + 1;
}

Assistant:

static BCReg rec_mm_prep(jit_State *J, ASMFunction cont)
{
  BCReg s, top = curr_proto(J->L)->framesize;
  TRef trcont;
  setcont(&J->L->base[top], cont);
#if LJ_64
  trcont = lj_ir_kptr(J, (void *)((int64_t)cont - (int64_t)lj_vm_asm_begin));
#else
  trcont = lj_ir_kptr(J, (void *)cont);
#endif
  J->base[top] = trcont | TREF_CONT;
  J->framedepth++;
  for (s = J->maxslot; s < top; s++)
    J->base[s] = 0;  /* Clear frame gap to avoid resurrecting previous refs. */
  return top+1;
}